

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O2

void __thiscall FKeyBindings::PerformBind(FKeyBindings *this,FCommandLine *argv,char *msg)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    Printf("%s:\n",msg);
    for (lVar4 = 0; lVar4 != 0x1c4; lVar4 = lVar4 + 1) {
      if (*(int *)(this->Binds[lVar4].Chars + -0xc) != 0) {
        pcVar3 = KeyName((int)lVar4);
        Printf("%s \"%s\"\n",pcVar3,this->Binds[lVar4].Chars);
      }
    }
    return;
  }
  pcVar3 = FCommandLine::operator[](argv,1);
  iVar1 = GetKeyFromName(pcVar3);
  if (iVar1 != 0) {
    iVar2 = FCommandLine::argc(argv);
    if (iVar2 == 2) {
      pcVar3 = FCommandLine::operator[](argv,1);
      Printf("\"%s\" = \"%s\"\n",pcVar3,this->Binds[iVar1].Chars);
      return;
    }
    pcVar3 = FCommandLine::operator[](argv,2);
    FString::operator=(this->Binds + iVar1,pcVar3);
    return;
  }
  pcVar3 = FCommandLine::operator[](argv,1);
  Printf("Unknown key \"%s\"\n",pcVar3);
  return;
}

Assistant:

void FKeyBindings::PerformBind(FCommandLine &argv, const char *msg)
{
	int i;

	if (argv.argc() > 1)
	{
		i = GetKeyFromName (argv[1]);
		if (!i)
		{
			Printf ("Unknown key \"%s\"\n", argv[1]);
			return;
		}
		if (argv.argc() == 2)
		{
			Printf ("\"%s\" = \"%s\"\n", argv[1], Binds[i].GetChars());
		}
		else
		{
			Binds[i] = argv[2];
		}
	}
	else
	{
		Printf ("%s:\n", msg);
		
		for (i = 0; i < NUM_KEYS; i++)
		{
			if (!Binds[i].IsEmpty())
				Printf ("%s \"%s\"\n", KeyName (i), Binds[i].GetChars());
		}
	}
}